

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O0

int test_remove_backend_servers(void)

{
  code *pcVar1;
  char *__s;
  SlbRemoveBackendServersRequestType *pSVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1e1;
  int ret;
  HttpTestListener *local_1c0;
  HttpTestListener *listener;
  string local_1b0;
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [55];
  allocator<char> local_129;
  string local_128 [32];
  SlbRemoveBackendServersRequestType *local_108;
  Slb *slb;
  SlbRemoveBackendServersResponseType resp;
  SlbRemoveBackendServersRequestType req;
  
  aliyun::SlbRemoveBackendServersRequestType::SlbRemoveBackendServersRequestType
            ((SlbRemoveBackendServersRequestType *)((long)&resp.load_balancer_id.field_2 + 8));
  aliyun::SlbRemoveBackendServersResponseType::SlbRemoveBackendServersResponseType
            ((SlbRemoveBackendServersResponseType *)&slb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"cn-hangzhou",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"my_appid",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"my_secret",&local_189);
  pSVar2 = (SlbRemoveBackendServersRequestType *)
           aliyun::Slb::CreateSlbClient(local_128,local_160,local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  local_108 = pSVar2;
  if (pSVar2 == (SlbRemoveBackendServersRequestType *)0x0) {
    aliyun::SlbRemoveBackendServersResponseType::~SlbRemoveBackendServersResponseType
              ((SlbRemoveBackendServersResponseType *)&slb);
    aliyun::SlbRemoveBackendServersRequestType::~SlbRemoveBackendServersRequestType
              ((SlbRemoveBackendServersRequestType *)((long)&resp.load_balancer_id.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetProxyHost((Slb *)pSVar2,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetUseTls((Slb *)local_108,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_remove_backend_servers_response;
  local_1c0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1e1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1e1);
  HttpTestListener::Start(local_1c0);
  std::__cxx11::string::operator=
            ((string *)(resp.load_balancer_id.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"LoadBalancerId");
  std::__cxx11::string::operator=
            ((string *)(req.load_balancer_id.field_2._M_local_buf + 8),"BackendServers");
  std::__cxx11::string::operator=
            ((string *)(req.backend_servers.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Slb::RemoveBackendServers
            (local_108,
             (SlbRemoveBackendServersResponseType *)((long)&resp.load_balancer_id.field_2 + 8),
             (SlbErrorInfo *)&slb);
  HttpTestListener::WaitComplete(local_1c0);
  pHVar3 = local_1c0;
  if (local_1c0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1c0);
    operator_delete(pHVar3,0x180);
  }
  pSVar2 = local_108;
  if (local_108 != (SlbRemoveBackendServersRequestType *)0x0) {
    aliyun::Slb::~Slb((Slb *)local_108);
    operator_delete(pSVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_remove_backend_servers() {
  SlbRemoveBackendServersRequestType req;
  SlbRemoveBackendServersResponseType resp;
  Slb* slb = Slb::CreateSlbClient("cn-hangzhou", "my_appid", "my_secret");
  if(!slb) return 0;
  slb->SetProxyHost("127.0.0.1:12234");
  slb->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_remove_backend_servers_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.load_balancer_id = "LoadBalancerId";
  req.backend_servers = "BackendServers";
  req.owner_account = "OwnerAccount";
  int ret = slb->RemoveBackendServers(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete slb;
}